

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void autocorr_fft(auto_fft_object obj,double *vec,double *acorr,int M)

{
  double dVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = obj->clen;
  if (iVar3 < M) {
    puts(
        "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1."
        );
    printf("\n The Output Vector only contains N calculated values.");
    iVar3 = iVar3 + -1;
  }
  else {
    iVar3 = 0;
    if (0 < M) {
      iVar3 = M;
    }
  }
  autocovar_fft(obj,vec,acorr,iVar3);
  dVar1 = *acorr;
  *acorr = 1.0;
  for (lVar2 = 1; lVar2 < iVar3; lVar2 = lVar2 + 1) {
    acorr[lVar2] = acorr[lVar2] / dVar1;
  }
  return;
}

Assistant:

void autocorr_fft(auto_fft_object obj,double* vec,double* acorr, int M) {
	double var;
	int i,N;
	N = obj->clen;
	if (M > N) {
		M = N - 1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	}
	else if (M < 0) {
		M = 0;
	}
	autocovar_fft(obj,vec,acorr,M);
	var = acorr[0];
	acorr[0] = 1.0;
	
	for(i = 1; i < M; i++) {
		acorr[i] = acorr[i]/var;
	}
	
}